

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O2

void BinaryenSIMDLoadStoreLaneSetVec(BinaryenExpressionRef expr,BinaryenExpressionRef vecExpr)

{
  if (expr->_id != SIMDLoadStoreLaneId) {
    __assert_fail("expression->is<SIMDLoadStoreLane>()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/binaryen-c.cpp"
                  ,0xd7d,
                  "void BinaryenSIMDLoadStoreLaneSetVec(BinaryenExpressionRef, BinaryenExpressionRef)"
                 );
  }
  if (vecExpr != (BinaryenExpressionRef)0x0) {
    expr[3].type.id = (uintptr_t)vecExpr;
    return;
  }
  __assert_fail("vecExpr",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/binaryen-c.cpp"
                ,0xd7e,
                "void BinaryenSIMDLoadStoreLaneSetVec(BinaryenExpressionRef, BinaryenExpressionRef)"
               );
}

Assistant:

void BinaryenSIMDLoadStoreLaneSetVec(BinaryenExpressionRef expr,
                                     BinaryenExpressionRef vecExpr) {
  auto* expression = (Expression*)expr;
  assert(expression->is<SIMDLoadStoreLane>());
  assert(vecExpr);
  static_cast<SIMDLoadStoreLane*>(expression)->vec = (Expression*)vecExpr;
}